

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool cmcmd::SymlinkInternal(string *file,string *link)

{
  bool bVar1;
  undefined1 local_38 [8];
  string linktext;
  string *link_local;
  string *file_local;
  
  linktext.field_2._8_8_ = link;
  bVar1 = cmsys::SystemTools::FileExists(link);
  if ((bVar1) ||
     (bVar1 = cmsys::SystemTools::FileIsSymlink((string *)linktext.field_2._8_8_), bVar1)) {
    cmsys::SystemTools::RemoveFile((string *)linktext.field_2._8_8_);
  }
  cmsys::SystemTools::GetFilenameName((string *)local_38,file);
  bVar1 = cmSystemTools::CreateSymlink
                    ((string *)local_38,(string *)linktext.field_2._8_8_,(string *)0x0);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool cmcmd::SymlinkInternal(std::string const& file, std::string const& link)
{
  if (cmSystemTools::FileExists(link) || cmSystemTools::FileIsSymlink(link)) {
    cmSystemTools::RemoveFile(link);
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  return cmSystemTools::CopyFileAlways(file, link);
#else
  std::string linktext = cmSystemTools::GetFilenameName(file);
  return cmSystemTools::CreateSymlink(linktext, link);
#endif
}